

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsResub.c
# Opt level: O1

int Abc_NtkMfsResubNode(Mfs_Man_t *p,Abc_Obj_t *pNode)

{
  void *pvVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  
  if (0 < (pNode->vFanins).nSize) {
    lVar4 = 0;
    do {
      pvVar1 = pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar4]];
      uVar3 = *(uint *)((long)pvVar1 + 0x14) & 0xf;
      if ((((uVar3 != 2) && (uVar3 != 5)) && (*(int *)((long)pvVar1 + 0x2c) == 1)) &&
         (iVar2 = Abc_NtkMfsSolveSatResub(p,pNode,(int)lVar4,0,0), iVar2 != 0)) {
        return 1;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < (pNode->vFanins).nSize);
  }
  if ((p->pPars->fArea == 0) && (0 < (pNode->vFanins).nSize)) {
    lVar4 = 0;
    do {
      pvVar1 = pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar4]];
      uVar3 = *(uint *)((long)pvVar1 + 0x14) & 0xf;
      if ((((uVar3 == 2) || (uVar3 == 5)) || (*(int *)((long)pvVar1 + 0x2c) != 1)) &&
         (iVar2 = Abc_NtkMfsSolveSatResub(p,pNode,(int)lVar4,1,0), iVar2 != 0)) {
        return 1;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < (pNode->vFanins).nSize);
  }
  return 0;
}

Assistant:

int Abc_NtkMfsResubNode( Mfs_Man_t * p, Abc_Obj_t * pNode )
{
    Abc_Obj_t * pFanin;
    int i;
    // try replacing area critical fanins
    Abc_ObjForEachFanin( pNode, pFanin, i )
        if ( !Abc_ObjIsCi(pFanin) && Abc_ObjFanoutNum(pFanin) == 1 )
        {
            if ( Abc_NtkMfsSolveSatResub( p, pNode, i, 0, 0 ) )
                return 1;
        }
    // try removing redundant edges
    if ( !p->pPars->fArea )
    {
        Abc_ObjForEachFanin( pNode, pFanin, i )
            if ( Abc_ObjIsCi(pFanin) || Abc_ObjFanoutNum(pFanin) != 1 )
            {
                if ( Abc_NtkMfsSolveSatResub( p, pNode, i, 1, 0 ) )
                    return 1;
            }
    }
    if ( Abc_ObjFaninNum(pNode) == p->nFaninMax )
        return 0;
/*
    // try replacing area critical fanins while adding two new fanins
    Abc_ObjForEachFanin( pNode, pFanin, i )
        if ( !Abc_ObjIsCi(pFanin) && Abc_ObjFanoutNum(pFanin) == 1 )
        {
            if ( Abc_NtkMfsSolveSatResub2( p, pNode, i, -1 ) )
                return 1;
        }
*/
    return 0;
}